

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O3

int Omega_h::add_state(FiniteAutomaton *fa)

{
  iterator __position;
  int row;
  Ref pvVar1;
  int col;
  int local_1c;
  
  row = get_nrows<int>(&fa->table);
  resize<int>(&fa->table,row + 1,(fa->table).ncols);
  if (0 < (fa->table).ncols) {
    col = 0;
    do {
      pvVar1 = at<int>(&fa->table,row,col);
      *pvVar1 = -1;
      col = col + 1;
    } while (col < (fa->table).ncols);
  }
  local_1c = -1;
  __position._M_current =
       (fa->accepted_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (fa->accepted_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&fa->accepted_tokens,__position,&local_1c);
  }
  else {
    *__position._M_current = -1;
    (fa->accepted_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return row;
}

Assistant:

int add_state(FiniteAutomaton& fa) {
  auto state = get_nstates(fa);
  resize(fa.table, state + 1, get_ncols(fa.table));
  for (int j = 0; j < get_ncols(fa.table); ++j) {
    at(fa.table, state, j) = -1;
  }
  fa.accepted_tokens.push_back(-1);
  return state;
}